

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

bool slang::ast::anon_unknown_39::isInProgram(Symbol *symbol)

{
  InstanceBodySymbol *this;
  DefinitionSymbol *pDVar1;
  Scope *this_00;
  Symbol *in_RDI;
  Scope *scope;
  Symbol *curr;
  Symbol *local_18;
  
  local_18 = in_RDI;
  while( true ) {
    if (local_18->kind == AnonymousProgram) {
      return true;
    }
    if (local_18->kind == InstanceBody) break;
    this_00 = Symbol::getParentScope(local_18);
    if (this_00 == (Scope *)0x0) {
      return false;
    }
    local_18 = Scope::asSymbol(this_00);
  }
  this = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x71d1b8);
  pDVar1 = InstanceBodySymbol::getDefinition(this);
  return pDVar1->definitionKind == Program;
}

Assistant:

bool isInProgram(const Symbol& symbol) {
    auto curr = &symbol;
    while (true) {
        if (curr->kind == SymbolKind::AnonymousProgram)
            return true;

        if (curr->kind == SymbolKind::InstanceBody) {
            return curr->as<InstanceBodySymbol>().getDefinition().definitionKind ==
                   DefinitionKind::Program;
        }

        auto scope = curr->getParentScope();
        if (!scope)
            return false;

        curr = &scope->asSymbol();
    }
}